

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O0

double nrm2(cupdlp_int n,double *x,cupdlp_int incx)

{
  long in_RSI;
  int in_EDI;
  double dVar1;
  int i;
  double nrm;
  undefined4 local_24;
  undefined8 local_20;
  
  local_20 = 0.0;
  for (local_24 = 0; local_24 < in_EDI; local_24 = local_24 + 1) {
    local_20 = *(double *)(in_RSI + (long)local_24 * 8) * *(double *)(in_RSI + (long)local_24 * 8) +
               local_20;
  }
  dVar1 = sqrt(local_20);
  return dVar1;
}

Assistant:

double nrm2(cupdlp_int n, const double *x, cupdlp_int incx) {
#ifdef USE_MY_BLAS
  assert(incx == 1);

  double nrm = 0.0;

  for (int i = 0; i < n; ++i) {
    nrm += x[i] * x[i];
  }

  return sqrt(nrm);
#else
  return dnrm2(n, x, incx);
#endif
}